

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::first
          (span<int,_18446744073709551615UL> *this,size_type count)

{
  span<int,_18446744073709551615UL> sVar1;
  logic_error *this_00;
  span<int,_18446744073709551615UL> local_20;
  
  if (count <= this->size_) {
    span<int_*,_0>(&local_20,this->data_,count);
    sVar1.size_ = local_20.size_;
    sVar1.data_ = local_20.data_;
    return sVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            ((logic_error *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1190: Precondition violation."
            );
  local_20.data_ = (pointer)&PTR__logic_error_0020bb38;
  std::logic_error::logic_error(this_00,(logic_error *)&local_20);
  *(undefined ***)this_00 = &PTR__logic_error_0020bb38;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    first( size_type count ) const
    {
        span_EXPECTS( detail::is_positive( count ) && count <= size() );

        return span< element_type, dynamic_extent >( data(), count );
    }